

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m256i * convolve_8tap_avx2(__m256i *ss,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *in_RSI;
  undefined1 (*in_RDI) [32];
  __m256i res_2367;
  __m256i res_0145;
  __m256i res_67;
  __m256i res_45;
  __m256i res_23;
  __m256i res_01;
  
  auVar1 = vpmaddubsw_avx2(*in_RDI,(undefined1  [32])*in_RSI);
  auVar2 = vpmaddubsw_avx2(in_RDI[1],(undefined1  [32])in_RSI[1]);
  auVar3 = vpmaddubsw_avx2(in_RDI[2],(undefined1  [32])in_RSI[2]);
  auVar4 = vpmaddubsw_avx2(in_RDI[3],(undefined1  [32])in_RSI[3]);
  auVar1 = vpaddw_avx2(auVar1,auVar3);
  auVar2 = vpaddw_avx2(auVar2,auVar4);
  vpaddw_avx2(auVar1,auVar2);
  return in_RSI;
}

Assistant:

static inline __m256i convolve_8tap_avx2(const __m256i ss[4],
                                         const __m256i coeffs[4]) {
  const __m256i res_01 = _mm256_maddubs_epi16(ss[0], coeffs[0]);
  const __m256i res_23 = _mm256_maddubs_epi16(ss[1], coeffs[1]);
  const __m256i res_45 = _mm256_maddubs_epi16(ss[2], coeffs[2]);
  const __m256i res_67 = _mm256_maddubs_epi16(ss[3], coeffs[3]);
  const __m256i res_0145 = _mm256_add_epi16(res_01, res_45);
  const __m256i res_2367 = _mm256_add_epi16(res_23, res_67);
  return _mm256_add_epi16(res_0145, res_2367);
}